

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewDocProp(xmlDocPtr doc,xmlChar *name,xmlChar *value)

{
  xmlChar *pxVar1;
  xmlNodePtr pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  _xmlNode *local_38;
  xmlNodePtr tmp;
  xmlAttrPtr cur;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x60);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlTreeErrMemory("building attribute");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x60);
      doc_local->type = XML_ATTRIBUTE_NODE;
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
        pxVar1 = xmlStrdup(name);
        doc_local->name = (char *)pxVar1;
      }
      else {
        pxVar1 = xmlDictLookup(doc->dict,name,-1);
        doc_local->name = (char *)pxVar1;
      }
      doc_local->doc = doc;
      if (value != (xmlChar *)0x0) {
        pxVar2 = xmlStringGetNodeList(doc,value);
        doc_local->children = pxVar2;
        doc_local->last = (_xmlNode *)0x0;
        for (local_38 = doc_local->children; local_38 != (_xmlNode *)0x0; local_38 = local_38->next)
        {
          local_38->parent = (_xmlNode *)doc_local;
          if (local_38->next == (_xmlNode *)0x0) {
            doc_local->last = local_38;
          }
        }
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)((xmlNodePtr)doc_local);
      }
    }
  }
  return (xmlAttrPtr)doc_local;
}

Assistant:

xmlAttrPtr
xmlNewDocProp(xmlDocPtr doc, const xmlChar *name, const xmlChar *value) {
    xmlAttrPtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewDocProp : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
	xmlTreeErrMemory("building attribute");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
	cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    cur->doc = doc;
    if (value != NULL) {
	xmlNodePtr tmp;

	cur->children = xmlStringGetNodeList(doc, value);
	cur->last = NULL;

	tmp = cur->children;
	while (tmp != NULL) {
	    tmp->parent = (xmlNodePtr) cur;
	    if (tmp->next == NULL)
		cur->last = tmp;
	    tmp = tmp->next;
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}